

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t google::protobuf::internal::(anonymous_namespace)::
       SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue_const*>
                 (KeyValue *it_xs,KeyValue *end_xs,KeyValue *it_ys,KeyValue *end_ys)

{
  difference_type dVar1;
  difference_type dVar2;
  KeyValue *in_RCX;
  KeyValue *in_RDX;
  int *in_RSI;
  int *in_RDI;
  size_t result;
  KeyValue *pKVar3;
  KeyValue *local_18;
  int *local_8;
  
  pKVar3 = (KeyValue *)0x0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while (local_8 != in_RSI && local_18 != in_RCX) {
    pKVar3 = (KeyValue *)((long)&pKVar3->first + 1);
    if (*local_8 < local_18->first) {
      local_8 = local_8 + 8;
    }
    else {
      if (*local_8 == local_18->first) {
        local_8 = local_8 + 8;
      }
      local_18 = local_18 + 1;
    }
  }
  dVar1 = std::distance<google::protobuf::internal::ExtensionSet::KeyValue*>(in_RCX,pKVar3);
  pKVar3 = (KeyValue *)((long)&pKVar3->first + dVar1);
  dVar2 = std::distance<google::protobuf::internal::ExtensionSet::KeyValue_const*>(in_RCX,pKVar3);
  return (long)&pKVar3->first + dVar2;
}

Assistant:

size_t SizeOfUnion(ItX it_xs, ItX end_xs, ItY it_ys, ItY end_ys) {
  size_t result = 0;
  while (it_xs != end_xs && it_ys != end_ys) {
    ++result;
    if (it_xs->first < it_ys->first) {
      ++it_xs;
    } else if (it_xs->first == it_ys->first) {
      ++it_xs;
      ++it_ys;
    } else {
      ++it_ys;
    }
  }
  result += std::distance(it_xs, end_xs);
  result += std::distance(it_ys, end_ys);
  return result;
}